

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadElemSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  undefined8 uVar4;
  uint local_e0;
  Enum local_dc;
  Index func_index_1;
  Enum local_d4;
  uint local_d0;
  Type TStack_cc;
  Index func_index;
  Enum local_c4;
  Enum local_c0;
  Type local_bc;
  Type type;
  uint local_ac;
  Opcode opcode;
  Index j;
  uint local_a0;
  Type TStack_9c;
  Index num_elem_exprs;
  Enum local_94;
  Type local_90;
  string local_88;
  Enum local_68;
  ExternalKind local_64;
  Enum local_60;
  ExternalKind kind;
  Enum local_58;
  Enum local_54;
  Enum local_50;
  Type local_4c;
  Type elem_type;
  Index table_index;
  uint local_34;
  uint32_t flags;
  Index i;
  uint local_28;
  Enum local_24;
  Index num_elem_segments;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_elem_segments = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8e])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (bVar1) {
    i = (Index)ReadCount(this,&local_28,"elem segment count");
    bVar1 = Failed((Result)i);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      flags = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8f])();
      bVar1 = Succeeded((Result)flags);
      if (bVar1) {
        for (local_34 = 0; local_34 < local_28; local_34 = local_34 + 1) {
          RVar2 = ReadU32Leb128(this,&table_index,"elem segment flags");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          if (7 < table_index) {
            PrintError(this,"invalid elem segment flags: %#x",(ulong)table_index);
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          elem_type.type_index_ = 0;
          if ((table_index & 3) == 2) {
            elem_type.enum_ =
                 (Enum)ReadIndex(this,&elem_type.type_index_,"elem segment table index");
            bVar1 = Failed((Result)elem_type.enum_);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          Type::Type(&local_4c,FuncRef);
          local_50 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x90])
                               (this->delegate_,(ulong)local_34,(ulong)elem_type.type_index_,
                                (ulong)(byte)table_index);
          bVar1 = Succeeded((Result)local_50);
          if (!bVar1) {
            PrintError(this,"BeginElemSegment callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          if ((table_index & 1) == 0) {
            local_54 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x91])
                                 (this->delegate_,(ulong)local_34);
            bVar1 = Succeeded((Result)local_54);
            if (!bVar1) {
              PrintError(this,"BeginElemSegmentInitExpr callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            local_58 = (Enum)ReadInitExpr(this,local_34);
            bVar1 = Failed((Result)local_58);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            kind = (*this->delegate_->_vptr_BinaryReaderDelegate[0x92])
                             (this->delegate_,(ulong)local_34);
            bVar1 = Succeeded((Result)kind);
            if (!bVar1) {
              PrintError(this,"EndElemSegmentInitExpr callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          if ((table_index & 3) != 0) {
            if ((table_index & 4) == 0) {
              local_68 = (Enum)ReadExternalKind(this,&local_64,"export kind");
              bVar1 = Failed((Result)local_68);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              if (local_64 != First) {
                Type::GetName_abi_cxx11_(&local_88,&local_4c);
                uVar4 = std::__cxx11::string::c_str();
                PrintError(this,"segment elem type must be func (%s)",uVar4);
                std::__cxx11::string::~string((string *)&local_88);
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              Type::Type(&local_90,FuncRef);
              local_4c = local_90;
            }
            else {
              local_60 = (Enum)ReadRefType(this,&local_4c,"table elem type");
              bVar1 = Failed((Result)local_60);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
          }
          TStack_9c = local_4c;
          local_94 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x93])
                               (this->delegate_,(ulong)local_34,local_4c);
          bVar1 = Succeeded((Result)local_94);
          if (!bVar1) {
            PrintError(this,"OnElemSegmentElemType callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2 = ReadCount(this,&local_a0,"elem count");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x94])
                                  (this->delegate_,(ulong)local_34,(ulong)local_a0);
          bVar1 = Succeeded(RVar2);
          if (!bVar1) {
            PrintError(this,"OnElemSegmentElemExprCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          for (local_ac = 0; local_ac < local_a0; local_ac = local_ac + 1) {
            if ((table_index & 4) == 0) {
              RVar2 = ReadIndex(this,&local_e0,"elem expr func index");
              bVar1 = Failed(RVar2);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x96])
                                      (this->delegate_,(ulong)local_34,(ulong)local_e0);
              bVar1 = Succeeded(RVar2);
              if (!bVar1) {
                PrintError(this,"OnElemSegmentElemExpr_RefFunc callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            else {
              type.enum_ = (Enum)ReadOpcode(this,(Opcode *)&type.type_index_,"elem expr opcode");
              bVar1 = Failed((Result)type.enum_);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              EVar3 = Opcode::operator_cast_to_Enum((Opcode *)&type.type_index_);
              if (EVar3 == RefNull) {
                local_c0 = (Enum)ReadRefType(this,&local_bc,"elem expr ref.null type");
                bVar1 = Failed((Result)local_c0);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  return (Result)this_local._4_4_;
                }
                TStack_cc = local_bc;
                local_c4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x95])
                                     (this->delegate_,(ulong)local_34,local_bc);
                bVar1 = Succeeded((Result)local_c4);
                if (!bVar1) {
                  PrintError(this,"OnElemSegmentElemExpr_RefNull callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  return (Result)this_local._4_4_;
                }
              }
              else {
                EVar3 = Opcode::operator_cast_to_Enum((Opcode *)&type.type_index_);
                if (EVar3 == RefFunc) {
                  local_d4 = (Enum)ReadIndex(this,&local_d0,"elem expr func index");
                  bVar1 = Failed((Result)local_d4);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    return (Result)this_local._4_4_;
                  }
                  func_index_1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x96])
                                           (this->delegate_,(ulong)local_34,(ulong)local_d0);
                  bVar1 = Succeeded((Result)func_index_1);
                  if (!bVar1) {
                    PrintError(this,"OnElemSegmentElemExpr_RefFunc callback failed");
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    return (Result)this_local._4_4_;
                  }
                }
                else {
                  PrintError(this,"expected ref.null or ref.func in passive element segment");
                }
              }
              local_dc = (Enum)ReadOpcode(this,(Opcode *)&type.type_index_,"opcode");
              bVar1 = Failed((Result)local_dc);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              EVar3 = Opcode::operator_cast_to_Enum((Opcode *)&type.type_index_);
              if (EVar3 != End) {
                PrintError(this,"expected END opcode after element expression");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x97])();
          bVar1 = Succeeded(RVar2);
          if (!bVar1) {
            PrintError(this,"EndElemSegment callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x98])();
        bVar1 = Succeeded(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndElemSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnElemSegmentCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginElemSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadElemSection(Offset section_size) {
  CALLBACK(BeginElemSection, section_size);
  Index num_elem_segments;
  CHECK_RESULT(ReadCount(&num_elem_segments, "elem segment count"));
  CALLBACK(OnElemSegmentCount, num_elem_segments);
  for (Index i = 0; i < num_elem_segments; ++i) {
    uint32_t flags;
    CHECK_RESULT(ReadU32Leb128(&flags, "elem segment flags"));
    ERROR_IF(flags > SegFlagMax, "invalid elem segment flags: %#x", flags);
    Index table_index(0);
    if ((flags & (SegPassive | SegExplicitIndex)) == SegExplicitIndex) {
      CHECK_RESULT(ReadIndex(&table_index, "elem segment table index"));
    }
    Type elem_type = Type::FuncRef;

    CALLBACK(BeginElemSegment, i, table_index, flags);

    if (!(flags & SegPassive)) {
      CALLBACK(BeginElemSegmentInitExpr, i);
      CHECK_RESULT(ReadInitExpr(i));
      CALLBACK(EndElemSegmentInitExpr, i);
    }

    // For backwards compat we support not declaring the element kind.
    if (flags & (SegPassive | SegExplicitIndex)) {
      if (flags & SegUseElemExprs) {
        CHECK_RESULT(ReadRefType(&elem_type, "table elem type"));
      } else {
        ExternalKind kind;
        CHECK_RESULT(ReadExternalKind(&kind, "export kind"));
        ERROR_UNLESS(kind == ExternalKind::Func,
                     "segment elem type must be func (%s)",
                     elem_type.GetName().c_str());
        elem_type = Type::FuncRef;
      }
    }

    CALLBACK(OnElemSegmentElemType, i, elem_type);

    Index num_elem_exprs;
    CHECK_RESULT(ReadCount(&num_elem_exprs, "elem count"));

    CALLBACK(OnElemSegmentElemExprCount, i, num_elem_exprs);
    for (Index j = 0; j < num_elem_exprs; ++j) {
      if (flags & SegUseElemExprs) {
        Opcode opcode;
        CHECK_RESULT(ReadOpcode(&opcode, "elem expr opcode"));
        if (opcode == Opcode::RefNull) {
          Type type;
          CHECK_RESULT(ReadRefType(&type, "elem expr ref.null type"));
          CALLBACK(OnElemSegmentElemExpr_RefNull, i, type);
        } else if (opcode == Opcode::RefFunc) {
          Index func_index;
          CHECK_RESULT(ReadIndex(&func_index, "elem expr func index"));
          CALLBACK(OnElemSegmentElemExpr_RefFunc, i, func_index);
        } else {
          PrintError(
              "expected ref.null or ref.func in passive element segment");
        }
        CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
        ERROR_UNLESS(opcode == Opcode::End,
                     "expected END opcode after element expression");
      } else {
        Index func_index;
        CHECK_RESULT(ReadIndex(&func_index, "elem expr func index"));
        CALLBACK(OnElemSegmentElemExpr_RefFunc, i, func_index);
      }
    }
    CALLBACK(EndElemSegment, i);
  }
  CALLBACK0(EndElemSection);
  return Result::Ok;
}